

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

adios2_error adios2_lock_reader_selections(adios2_engine *engine)

{
  string *in_stack_00000028;
  adios2_engine *in_stack_00000030;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"for adios2_engine, in call to adios2_lock_reader_selections",&local_31);
  adios2::helper::CheckForNullptr<adios2_engine>(in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  adios2::core::Engine::LockReaderSelections();
  return adios2_error_none;
}

Assistant:

adios2_error adios2_lock_reader_selections(adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(
            engine, "for adios2_engine, in call to adios2_lock_reader_selections");
        reinterpret_cast<adios2::core::Engine *>(engine)->LockReaderSelections();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_engine_type"));
    }
}